

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O2

void ctor_suite::copy_assign_int(void)

{
  undefined1 local_29;
  test_union<int,_bool,_int> other;
  test_union<int,_bool,_int> data;
  
  data.current = 0;
  data.storage.__data[0] = '\x01';
  other.storage.__data[0] = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.get<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/small_union_suite.cpp"
             ,0x40,"void ctor_suite::copy_assign_int()",&data,&other);
  other.current = 0;
  other.storage.__data[0] = '\0';
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  operator=(&other,&data);
  local_29 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("other.get<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/small_union_suite.cpp"
             ,0x43,"void ctor_suite::copy_assign_int()",&other,&local_29);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  ~small_union(&other);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  ~small_union(&data);
  return;
}

Assistant:

void copy_assign_int()
{
    test_union<int, bool, int> data{true};
    TRIAL_PROTOCOL_TEST_EQUAL(data.get<bool>(), true);
    test_union<int, bool, int> other{false};
    other = data;
    TRIAL_PROTOCOL_TEST_EQUAL(other.get<bool>(), true);
}